

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

void __thiscall kratos::EventControl::EventControl(EventControl *this,EventEdgeType edge,Var *var)

{
  int iVar1;
  UserException *this_00;
  string local_40;
  
  this->delay = 0;
  this->var = var;
  this->type = Edge;
  this->edge = edge;
  this->delay_side = left;
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
  if (iVar1 == 1) {
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Event control variable cannot be a scalar","");
  UserException::UserException(this_00,&local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EventControl::EventControl(kratos::EventEdgeType edge, kratos::Var &var)
    : var(&var), type(EventControlType::Edge), edge(edge) {
    if (var.width() != 1) {
        throw UserException("Event control variable cannot be a scalar");
    }
}